

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerSettings.cpp
# Opt level: O0

void __thiscall MidiAnalyzerSettings::MidiAnalyzerSettings(MidiAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  element_type *peVar1;
  ulong uVar2;
  uint uVar3;
  MidiAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__MidiAnalyzerSettings_0010dd68;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x7a12;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mInputChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::auto_ptr
            (&this->mBitRateInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mStopBitsInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mParityInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mDataBitsInterface,(element_type *)0x0);
  uVar2 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mEndiannessInterface,(element_type *)0x0);
  this->mParity = 3.0;
  this->mStopBits = 1.0;
  this->mDataBits = '\b';
  this->mEndianness = true;
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar2);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mInputChannelInterface,this_00);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar1,"MIDI");
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mInputChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar3 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar3,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar3,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar3,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

MidiAnalyzerSettings::MidiAnalyzerSettings() : mInputChannel( UNDEFINED_CHANNEL ), mBitRate( 31250 )
{
    mParity = 3;     // default is No parity.
    mStopBits = 1;   // default is 1 stop bit.  1=1, 2=1.5, 3=2.
    mDataBits = 8;   // default
    mEndianness = 1; // TRUE, Big Endian is default.  0=FALSE=LE, 1=TRUE=BE.
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "MIDI", "General MIDI" );
    mInputChannelInterface->SetChannel( mInputChannel );
    /*
        mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
        mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/S)",  "Specify the bit rate in bits per second." );
        mBitRateInterface->SetMax( 31250 );
        mBitRateInterface->SetMin( 31250 ); // Midi only has one speed.  Tolerance is +/- 1%.
        mBitRateInterface->SetInteger( mBitRate );

        mStopBitsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
        mStopBitsInterface->SetTitleAndTooltip( "Stop Bits", "Specify number of stop bits, 1, 1.5, or 2." );
        mStopBitsInterface->AddNumber( 1, "1", "1 stop bit (common)");
        mStopBitsInterface->AddNumber( 1.5, "1.5", "1.5 stop bits (rare)");
        mStopBitsInterface->AddNumber( 2, "2", "2 stop bits (less common, better for noisy lines)");
        mStopBitsInterface->SetNumber( mStopBits );

        mParityInterface.reset( new AnalyzerSettingInterfaceNumberList() );
        mParityInterface->SetTitleAndTooltip( "Parity", "Parity:  Even, Odd, or None." );
        mParityInterface->AddNumber( 1, "Even", "Even Parity");
        mParityInterface->AddNumber( 2, "Odd", "Odd Parity");
        mParityInterface->AddNumber( 3, "None", "No Parity");
        mParityInterface->SetNumber( mParity );

        // FIXME: the below is unfinished!
        mDataBitsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
        mDataBitsInterface->SetTitleAndTooltip( "Data Bits", "" );
        mDataBitsInterface->AddNumber( 1, "Even", "Even Parity");
        mDataBitsInterface->AddNumber( 2, "Odd", "Odd Parity");
        mDataBitsInterface->AddNumber( 3, "None", "No Parity");
        mDataBitsInterface->SetNumber( mParity );

        mEndiannessInterface.reset( new AnalyzerSettingInterfaceNumberList() );
        mEndiannessInterface->SetTitleAndTooltip( "Endianness", "Little or Big Endian" );
        mEndiannessInterface->AddNumber( 0, "Little", "Odd Parity");
        mEndiannessInterface->AddNumber( 1, "Big", "Even Parity");
        mEndiannessInterface->SetNumber( mParity );
    */

    AddInterface( mInputChannelInterface.get() );
    // AddInterface( mBitRateInterface.get() );
    // AddInterface( mStopBitsInterface.get() );
    // AddInterface( mParityInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "MIDI", false );
}